

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

prf_node_t * prf_state_get_instance(prf_state_t *state,int16_t number)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = prf_array_count(state->instances);
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      if (*(short *)(state->instances[uVar2]->data + 2) == number) {
        return state->instances[uVar2];
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return (prf_node_t *)0x0;
}

Assistant:

prf_node_t *
prf_state_get_instance(
    prf_state_t * state, 
    int16_t number )
{
    int i, n;

    n = prf_array_count(state->instances);
    for (i = 0; i < n; i++) {
        struct prf_instance_definition_data * data = 
            (struct prf_instance_definition_data *) state->instances[i]->data;
        if ( data->instance_definition_number == number )
            return state->instances[i];
    }
    return NULL;
}